

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O1

idx_t __thiscall
duckdb::HashAggregateDistinctFinalizeEvent::CreateGlobalSources
          (HashAggregateDistinctFinalizeEvent *this)

{
  PhysicalHashAggregate *pPVar1;
  PhysicalHashAggregate *pPVar2;
  size_type __n;
  HashAggregateDistinctFinalizeEvent *pHVar3;
  const_reference pvVar4;
  reference pvVar5;
  const_reference this_00;
  pointer this_01;
  BoundAggregateExpression *pBVar6;
  mapped_type *pmVar7;
  reference this_02;
  pointer this_03;
  reference this_04;
  type sink_p;
  idx_t iVar8;
  ClientContext *context;
  pointer __n_00;
  vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>
  aggregate_sources;
  _Head_base<0UL,_duckdb::GlobalSourceState_*,_false> local_90;
  pointer local_88;
  pointer local_80;
  HashAggregateDistinctFinalizeEvent *local_78;
  GroupedAggregateData *local_70;
  type local_68;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  pointer local_48;
  pointer pVStack_40;
  element_type *local_38;
  
  pPVar1 = this->op;
  local_60 = (pointer)&this->global_source_states;
  ::std::
  vector<duckdb::vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>_>_>
  ::reserve((vector<duckdb::vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>_>_>
             *)local_60,
            ((long)(pPVar1->groupings).
                   super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                   .
                   super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pPVar1->groupings).
                   super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                   .
                   super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7);
  pPVar2 = this->op;
  if ((pPVar2->groupings).
      super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      .
      super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pPVar2->groupings).
      super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      .
      super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_88 = (pointer)0x0;
  }
  else {
    local_88 = (pointer)0x0;
    __n_00 = (pointer)0x0;
    local_78 = this;
    do {
      pHVar3 = local_78;
      pvVar4 = vector<duckdb::HashAggregateGroupingData,_true>::operator[]
                         (&pPVar2->groupings,(size_type)__n_00);
      local_58 = __n_00;
      pvVar5 = vector<duckdb::HashAggregateGroupingGlobalState,_true>::operator[]
                         (&pHVar3->gstate->grouping_states,(size_type)__n_00);
      local_70 = (GroupedAggregateData *)
                 unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>,_true>
                 ::operator*(&pvVar5->distinct_state);
      local_68 = unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
                 ::operator*(&pvVar4->distinct_data);
      local_48 = (pointer)0x0;
      pVStack_40 = (pointer)0x0;
      local_38 = (element_type *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>_>_>
      ::reserve((vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>_>_>
                 *)&local_48,
                (long)(pPVar1->grouped_aggregate_data).aggregates.
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pPVar1->grouped_aggregate_data).aggregates.
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3);
      local_80 = (pointer)0x0;
      if ((pPVar1->grouped_aggregate_data).aggregates.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (pPVar1->grouped_aggregate_data).aggregates.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_50 = (pointer)&local_68->radix_tables;
        local_70 = (GroupedAggregateData *)&local_70->aggregates;
        do {
          this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[](&(pPVar1->grouped_aggregate_data).aggregates,(size_type)local_80);
          this_01 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(this_00);
          pBVar6 = BaseExpression::Cast<duckdb::BoundAggregateExpression>
                             (&this_01->super_BaseExpression);
          if (pBVar6->aggr_type == DISTINCT) {
            pmVar7 = ::std::__detail::
                     _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_68->info->table_map,(key_type *)&local_80);
            __n = *pmVar7;
            this_02 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                      ::operator[]((vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                                    *)local_50,__n);
            this_03 = unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
                      ::operator->(this_02);
            this_04 = vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_true>
                      ::operator[]((vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_true>
                                    *)local_70,__n);
            sink_p = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                     ::operator*(this_04);
            iVar8 = RadixPartitionedHashTable::MaxThreads(this_03,sink_p);
            context = (ClientContext *)
                      unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
                      ::operator->(this_02);
            RadixPartitionedHashTable::GetGlobalSourceState
                      ((RadixPartitionedHashTable *)&local_90,context);
            ::std::
            vector<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>,std::allocator<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>,std::allocator<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>>>
                        *)&local_48,
                       (unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
                        *)&local_90);
            if (local_90._M_head_impl != (GlobalSourceState *)0x0) {
              (**(code **)(*(long *)&((_Rep_type *)&(local_90._M_head_impl)->_vptr_GlobalSourceState
                                     )->_M_impl + 8))();
            }
            local_88 = (pointer)((long)local_88 + iVar8);
          }
          else {
            local_90._M_head_impl = (GlobalSourceState *)0x0;
            ::std::
            vector<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>,std::allocator<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>,std::allocator<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>>>
                        *)&local_48,
                       (unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
                        *)&local_90);
            if (local_90._M_head_impl != (GlobalSourceState *)0x0) {
              (**(code **)(*(long *)&((_Rep_type *)&(local_90._M_head_impl)->_vptr_GlobalSourceState
                                     )->_M_impl + 8))();
            }
          }
          local_80 = (pointer)((long)local_80 + 1);
        } while (local_80 <
                 (pointer)((long)(pPVar1->grouped_aggregate_data).aggregates.
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pPVar1->grouped_aggregate_data).aggregates.
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      ::std::
      vector<duckdb::vector<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>,true>,std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>,true>>>
      ::
      emplace_back<duckdb::vector<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>,true>>
                ((vector<duckdb::vector<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>,true>,std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>,true>>>
                  *)local_60,
                 (vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>
                  *)&local_48);
      ::std::
      vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>_>_>
                 *)&local_48);
      __n_00 = (pointer)&local_58->physical_type_;
      pPVar2 = local_78->op;
    } while (__n_00 < (undefined1 *)
                      (((long)(pPVar2->groupings).
                              super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                              .
                              super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pPVar2->groupings).
                              super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                              .
                              super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7))
    ;
  }
  return (long)local_88 + (ulong)(local_88 == (pointer)0x0);
}

Assistant:

idx_t HashAggregateDistinctFinalizeEvent::CreateGlobalSources() {
	auto &aggregates = op.grouped_aggregate_data.aggregates;
	global_source_states.reserve(op.groupings.size());

	idx_t n_tasks = 0;
	for (idx_t grouping_idx = 0; grouping_idx < op.groupings.size(); grouping_idx++) {
		auto &grouping = op.groupings[grouping_idx];
		auto &distinct_state = *gstate.grouping_states[grouping_idx].distinct_state;
		auto &distinct_data = *grouping.distinct_data;

		vector<unique_ptr<GlobalSourceState>> aggregate_sources;
		aggregate_sources.reserve(aggregates.size());
		for (idx_t agg_idx = 0; agg_idx < aggregates.size(); agg_idx++) {
			auto &aggregate = aggregates[agg_idx];
			auto &aggr = aggregate->Cast<BoundAggregateExpression>();

			if (!aggr.IsDistinct()) {
				aggregate_sources.push_back(nullptr);
				continue;
			}
			D_ASSERT(distinct_data.info.table_map.count(agg_idx));

			auto table_idx = distinct_data.info.table_map.at(agg_idx);
			auto &radix_table_p = distinct_data.radix_tables[table_idx];
			n_tasks += radix_table_p->MaxThreads(*distinct_state.radix_states[table_idx]);
			aggregate_sources.push_back(radix_table_p->GetGlobalSourceState(context));
		}
		global_source_states.push_back(std::move(aggregate_sources));
	}

	return MaxValue<idx_t>(n_tasks, 1);
}